

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O2

void __thiscall
QRhiImplementation::addCleanupCallback(QRhiImplementation *this,void *key,CleanupCallback *callback)

{
  function<void_(QRhi_*)> *this_00;
  long in_FS_OFFSET;
  void *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = key;
  this_00 = QHash<const_void_*,_std::function<void_(QRhi_*)>_>::operator[]
                      (&this->keyedCleanupCallbacks,&local_18);
  std::function<void_(QRhi_*)>::operator=(this_00,callback);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addCleanupCallback(const void *key, const QRhi::CleanupCallback &callback)
    {
        keyedCleanupCallbacks[key] = callback;
    }